

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led_impl.cpp
# Opt level: O3

Element __thiscall ui::LedPanel::Render(LedPanel *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long lVar2;
  long in_RSI;
  Element EVar3;
  initializer_list<std::shared_ptr<ftxui::Node>_> __l;
  allocator_type local_119;
  shared_ptr<ftxui::Node> local_118;
  shared_ptr<ftxui::Node> local_108;
  Element local_f8;
  string local_e8;
  string local_c8;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_a8;
  Decorator local_90;
  shared_ptr<ftxui::Node> local_70;
  ftxui local_60 [32];
  undefined1 local_40 [16];
  
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Select a LED:","");
  ftxui::text((ftxui *)&local_70,&local_c8);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8," ","");
  EVar3 = ftxui::text((ftxui *)&local_108,&local_e8);
  (**(code **)(**(long **)(in_RSI + 0x48) + 0x10))
            (&local_118,*(long **)(in_RSI + 0x48),
             EVar3.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
             _M_pi);
  ftxui::hbox<std::shared_ptr<ftxui::Node>,std::shared_ptr<ftxui::Node>>
            (local_60,&local_108,&local_118);
  EVar3 = ftxui::separator();
  (**(code **)(**(long **)(in_RSI + 0x58) + 0x10))
            (local_40,*(long **)(in_RSI + 0x58),
             EVar3.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
             _M_pi);
  __l._M_len = 4;
  __l._M_array = &local_70;
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            (&local_a8,__l,&local_119);
  ftxui::vbox((ftxui *)&local_f8,&local_a8);
  local_90.super__Function_base._M_functor._8_8_ = 0;
  local_90.super__Function_base._M_functor._M_unused._M_object = ftxui::frame;
  local_90._M_invoker =
       std::
       _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
       ::_M_invoke;
  local_90.super__Function_base._M_manager =
       std::
       _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
       ::_M_manager;
  ftxui::operator|((ftxui *)this,&local_f8,&local_90);
  if (local_90.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_90.super__Function_base._M_manager)
              ((_Any_data *)&local_90,(_Any_data *)&local_90,__destroy_functor);
  }
  if (local_f8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_a8);
  lVar2 = 0x40;
  _Var1._M_pi = extraout_RDX;
  do {
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_90._M_invoker + lVar2)
    ;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      _Var1._M_pi = extraout_RDX_00;
    }
    lVar2 = lVar2 + -0x10;
  } while (lVar2 != 0);
  if (local_118.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var1._M_pi = extraout_RDX_01;
  }
  if (local_108.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var1._M_pi = extraout_RDX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    _Var1._M_pi = extraout_RDX_03;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    _Var1._M_pi = extraout_RDX_04;
  }
  EVar3.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  EVar3.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar3.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() override {
    return vbox({
               text("Select a LED:"),
               hbox(text(" "), radiobox_->Render()),
               separator(),
               led_tab_->Render(),
           }) |
           frame;
  }